

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O0

void __thiscall
OpenMD::HydroIO::writeHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature,ostream *os)

{
  Mat3x3d *in_RSI;
  long in_RDI;
  RealType in_stack_00000030;
  HydroProp *in_stack_00000038;
  uint j_2;
  uint i_6;
  uint i_5;
  uint i_4;
  uint j_1;
  uint i_3;
  uint i_2;
  uint j;
  uint i_1;
  uint i;
  RealType pitchScalar;
  Vector3d pitches;
  Mat3x3d pitchAxes;
  Vector3d cop;
  Mat6x6d Xid;
  Vector3d cod;
  Mat6x6d Xi;
  Vector3d cor;
  string name;
  string h;
  undefined4 in_stack_fffffffffffffbb8;
  SizeType in_stack_fffffffffffffbbc;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_fffffffffffffbc0;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_fffffffffffffbc8;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_fffffffffffffbd0;
  allocator<char> *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  HydroIO *in_stack_fffffffffffffc10;
  RealType *in_stack_fffffffffffffc28;
  Vector3d *in_stack_fffffffffffffc30;
  HydroProp *this_00;
  uint local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  uint local_398;
  uint local_394;
  uint local_390;
  uint local_38c;
  Vector<double,_3U> local_380 [3];
  HydroProp *in_stack_fffffffffffffcc8;
  Vector<double,_3U> local_320 [2];
  RectMatrix<double,_6U,_6U> local_2f0;
  Vector<double,_3U> local_1d0;
  RectMatrix<double,_6U,_6U> local_1b8;
  Vector<double,_3U> local_98;
  string local_80 [55];
  undefined1 local_49 [57];
  Mat3x3d *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    openWriter(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  }
  this_00 = (HydroProp *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  HydroProp::getName_abi_cxx11_
            ((HydroProp *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  HydroProp::getCenterOfResistance
            ((HydroProp *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  HydroProp::getResistanceTensor
            ((HydroProp *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  HydroProp::getCenterOfDiffusion(in_stack_00000038,in_stack_00000030);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbc0,
             (Vector3<double> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  HydroProp::getDiffusionTensorAtPos
            ((HydroProp *)Xi.super_RectMatrix<double,_6U,_6U>.data_[2][5],
             (Vector3d *)Xi.super_RectMatrix<double,_6U,_6U>.data_[2][4],
             Xi.super_RectMatrix<double,_6U,_6U>.data_[2][3]);
  HydroProp::getCenterOfPitch(in_stack_fffffffffffffcc8);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3d1837);
  Vector3<double>::Vector3((Vector3<double> *)0x3d1846);
  HydroProp::pitchAxes(this_00,local_10,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  std::__cxx11::string::c_str();
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(in_stack_fffffffffffffbc0,
           (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatSingleLineArray);
  for (local_38c = 0; local_38c < 3; local_38c = local_38c + 1) {
    Vector<double,_3U>::operator[](&local_98,local_38c);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(in_stack_fffffffffffffbc0,
             (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatDefault);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  for (local_390 = 0; local_390 < 6; local_390 = local_390 + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(in_stack_fffffffffffffbc8);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatSingleLineArray);
    for (local_394 = 0; local_394 < 6; local_394 = local_394 + 1) {
      RectMatrix<double,_6U,_6U>::operator()(&local_1b8,local_390,local_394);
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(in_stack_fffffffffffffbc0,
               (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatDefault);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(in_stack_fffffffffffffbc0,
           (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatSingleLineArray);
  for (local_398 = 0; local_398 < 3; local_398 = local_398 + 1) {
    Vector<double,_3U>::operator[](&local_1d0,local_398);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(in_stack_fffffffffffffbc0,
             (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatDefault);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  for (local_39c = 0; local_39c < 6; local_39c = local_39c + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(in_stack_fffffffffffffbc8);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatSingleLineArray);
    for (local_3a0 = 0; local_3a0 < 6; local_3a0 = local_3a0 + 1) {
      RectMatrix<double,_6U,_6U>::operator()(&local_2f0,local_39c,local_3a0);
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(in_stack_fffffffffffffbc0,
               (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatDefault);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Double(in_stack_fffffffffffffbc0,
           (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatSingleLineArray);
  for (local_3a4 = 0; local_3a4 < 3; local_3a4 = local_3a4 + 1) {
    Vector<double,_3U>::operator[](local_320,local_3a4);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(in_stack_fffffffffffffbc0,
             (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatDefault);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatSingleLineArray);
  for (local_3a8 = 0; local_3a8 < 3; local_3a8 = local_3a8 + 1) {
    in_stack_fffffffffffffbd0 =
         (PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          *)(in_RDI + 0x10);
    Vector<double,_3U>::operator[](local_380,local_3a8);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Double(in_stack_fffffffffffffbc0,
             (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      *)(in_RDI + 0x10),kFormatDefault);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(in_stack_fffffffffffffbd0,(Ch *)in_stack_fffffffffffffbc8);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(in_stack_fffffffffffffbc8);
  for (local_3ac = 0; local_3ac < 3; local_3ac = local_3ac + 1) {
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(in_stack_fffffffffffffbc8);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatSingleLineArray);
    for (local_3b0 = 0; local_3b0 < 3; local_3b0 = local_3b0 + 1) {
      in_stack_fffffffffffffbc0 =
           (PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *)(in_RDI + 0x10);
      in_stack_fffffffffffffbc8 =
           (PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *)RectMatrix<double,_3U,_3U>::operator()
                        ((RectMatrix<double,_3U,_3U> *)(local_380 + 1),local_3ac,local_3b0);
      rapidjson::
      PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      ::Double(in_stack_fffffffffffffbc0,
               (double)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    }
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)(in_RDI + 0x10),kFormatDefault);
  }
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3d2157);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d2164);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d2171);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  return;
}

Assistant:

void HydroIO::writeHydroProp(HydroProp* hp, RealType viscosity,
                               RealType temperature, std::ostream& os) {
    if (!writerOpen_) openWriter(os);

    std::string h    = "OpenMD-Hydro";
    std::string name = hp->getName();
    Vector3d cor     = hp->getCenterOfResistance();
    Mat6x6d Xi       = hp->getResistanceTensor();
    Vector3d cod     = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid      = hp->getDiffusionTensorAtPos(cod, temperature);
    Vector3d cop     = hp->getCenterOfPitch();
    Mat3x3d pitchAxes;
    Vector3d pitches;
    RealType pitchScalar;

    hp->pitchAxes(pitchAxes, pitches, pitchScalar);

#if defined(NLOHMANN_JSON)

    ordered_json o;
    o["name"]               = name;
    o["viscosity"]          = viscosity;
    o["centerOfResistance"] = {cor[0], cor[1], cor[2]};
    o["resistanceTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["resistanceTensor"][i] = {Xi(i, 0), Xi(i, 1), Xi(i, 2),
                                  Xi(i, 3), Xi(i, 4), Xi(i, 5)};
    }

    o["temperature"]       = temperature;
    o["centerOfDiffusion"] = {cod[0], cod[1], cod[2]};
    o["diffusionTensor"]   = json::array();

    for (unsigned int i = 0; i < 6; i++) {
      o["diffusionTensor"][i] = {Xid(i, 0), Xid(i, 1), Xid(i, 2),
                                 Xid(i, 3), Xid(i, 4), Xid(i, 5)};
    }

    o["pitch"]          = pitchScalar;
    o["centerOfPitch"]  = {cop[0], cop[1], cop[2]};
    o["momentsOfPitch"] = {pitches[0], pitches[1], pitches[2]};

    o["pitchAxes"] = json::array();
    for (unsigned int i = 0; i < 3; i++) {
      o["pitchAxes"][i] = {pitchAxes(i, 0), pitchAxes(i, 1), pitchAxes(i, 2)};
    }

    j_[h].push_back(o);

#elif defined(RAPID_JSON)

    w_.StartObject();
    w_.Key("name");
    w_.String(name.c_str());

    w_.Key("viscosity");
    w_.Double(viscosity);
    w_.Key("centerOfResistance");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cor[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("resistanceTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xi(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("temperature");
    w_.Double(temperature);
    w_.Key("centerOfDiffusion");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);

    for (unsigned i = 0; i < 3; i++)
      w_.Double(cod[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("diffusionTensor");
    w_.StartArray();
    for (unsigned i = 0; i < 6; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);

      for (unsigned j = 0; j < 6; j++) {
        w_.Double(Xid(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.Key("pitch");
    w_.Double(pitchScalar);

    w_.Key("centerOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(cop[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("momentsOfPitch");
    w_.StartArray();
    w_.SetFormatOptions(kFormatSingleLineArray);
    for (unsigned i = 0; i < 3; i++)
      w_.Double(pitches[i]);
    w_.EndArray();
    w_.SetFormatOptions(kFormatDefault);

    w_.Key("pitchAxes");
    w_.StartArray();
    for (unsigned i = 0; i < 3; i++) {
      w_.StartArray();
      w_.SetFormatOptions(kFormatSingleLineArray);
      for (unsigned j = 0; j < 3; j++) {
        w_.Double(pitchAxes(i, j));
      }
      w_.EndArray();
      w_.SetFormatOptions(kFormatDefault);
    }
    w_.EndArray();

    w_.EndObject();
#endif
  }